

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O0

void sysbvm_bytecode_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_tuple_t sVar1;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_tuple_uint8_encode('\0');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Nop",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('\x01');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Breakpoint",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('\x02');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Unreachable",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('\x10');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Return",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('\x11');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Jump",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('\x1f');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::CountExtension",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode(' ');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Alloca",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('!');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Move",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('\"');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Load",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('#');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::LoadSymbolValueBinding",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('$');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Store",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('%');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::JumpIfTrue",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('&');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::JumpIfFalse",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('\'');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SetDebugValue",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('0');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::AllocaWithValue",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('1');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::CoerceValue",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('2');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::DownCastValue",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('3');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::UncheckedDownCastValue",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('4');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeAssociation",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('6');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SlotAt",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('7');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SlotReferenceAt",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('8');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SlotAtPut",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('9');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::RefSlotAt",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode(':');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::RefSlotReferenceAt",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode(';');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::RefSlotAtPut",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('@');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Call",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('P');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::UncheckedCall",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('`');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Send",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('p');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SendWithLookup",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode(0x80);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeArrayWithElements",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode(0x90);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeByteArrayWithElements",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode(0xa0);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeClosureWithCaptures",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode(0xb0);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeDictionaryWithElements",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode(0xc0);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeTupleWithElements",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode(0xe0);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::CaseJump",sVar1);
  sVar1 = sysbvm_tuple_uint8_encode('@');
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::FirstVariable",sVar1);
  sVar1 = sysbvm_tuple_int16_encode(0);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Arguments",sVar1);
  sVar1 = sysbvm_tuple_int16_encode(1);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Captures",sVar1);
  sVar1 = sysbvm_tuple_int16_encode(2);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Literal",sVar1);
  sVar1 = sysbvm_tuple_int16_encode(3);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Local",sVar1);
  sVar1 = sysbvm_tuple_int16_encode(2);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Bits",sVar1);
  sVar1 = sysbvm_tuple_int16_encode(3);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::BitMask",sVar1);
  return;
}

Assistant:

void sysbvm_bytecode_setupPrimitives(sysbvm_context_t *context)
{
    // Export the function opcodes.

    // Zero operands.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Nop", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_NOP));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Breakpoint", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_BREAKPOINT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Unreachable", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_UNREACHABLE));

    // One operands.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Return", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_RETURN));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Jump", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_JUMP));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::CountExtension", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_COUNT_EXTENSION));

    // Two operands.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Alloca", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_ALLOCA));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Move", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MOVE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Load", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_LOAD));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::LoadSymbolValueBinding", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_LOAD_SYMBOL_VALUE_BINDING));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Store", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_STORE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::JumpIfTrue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_JUMP_IF_TRUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::JumpIfFalse", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_JUMP_IF_FALSE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SetDebugValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SET_DEBUG_VALUE));

    // Three operands.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::AllocaWithValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_ALLOCA_WITH_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::CoerceValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_COERCE_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::DownCastValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_DOWNCAST_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::UncheckedDownCastValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_UNCHECKED_DOWNCAST_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeAssociation", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_ASSOCIATION));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SlotAt", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SLOT_AT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SlotReferenceAt", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SLOT_REFERENCE_AT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SlotAtPut", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SLOT_AT_PUT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::RefSlotAt", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_REF_SLOT_AT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::RefSlotReferenceAt", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_REF_SLOT_REFERENCE_AT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::RefSlotAtPut", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_REF_SLOT_AT_PUT));

    // Variable operand count.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Call", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_CALL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::UncheckedCall", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_UNCHECKED_CALL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Send", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SEND));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SendWithLookup", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SEND_WITH_LOOKUP));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeArrayWithElements", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_ARRAY_WITH_ELEMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeByteArrayWithElements", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_BYTE_ARRAY_WITH_ELEMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeClosureWithCaptures", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_CLOSURE_WITH_CAPTURES));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeDictionaryWithElements", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_DICTIONARY_WITH_ELEMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeTupleWithElements", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_TUPLE_WITH_ELEMENTS));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::CaseJump", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_CASE_JUMP));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::FirstVariable", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_FIRST_VARIABLE));

    // Export the operand vector names.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Arguments", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_ARGUMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Captures", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_CAPTURES));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Literal", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_LITERAL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Local", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_LOCAL));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Bits", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_BITS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::BitMask", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_BITMASK));
}